

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.h
# Opt level: O2

void __thiscall
Perseus::
PlanEndOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
          (Perseus *this,
          vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
          *V)

{
  JointBeliefInterface *pJVar1;
  PlanningUnitMADPDiscrete *this_00;
  double dVar2;
  
  PlanEndOfIteration(this);
  this_00 = *(PlanningUnitMADPDiscrete **)((long)&this->_m_verbose + (long)this->_vptr_Perseus[-3]);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               ((long)&this->_m_bestValue + (long)this->_vptr_Perseus[-3]);
  }
  pJVar1 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(this_00);
  dVar2 = BeliefValue::GetValue
                    ((BeliefInterface *)(&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8)),V);
  (**(code **)((long)*pJVar1 + 8))(pJVar1);
  if (this->_m_bestValue < dVar2) {
    this->_m_bestValue = dVar2;
    (*this->_vptr_Perseus[3])(this,V);
    if (this->_m_dryrun == false) {
      (*this->_vptr_Perseus[7])(this,&this->_m_valueFunctionFilename);
      return;
    }
  }
  return;
}

Assistant:

void PlanEndOfIteration(const VF &V)
        {
            PlanEndOfIteration();
            
            JointBeliefInterface* jb0 = GetPU()->GetNewJointBeliefFromISD();
            double value=BeliefValue::GetValue(*jb0, V);
            delete jb0;

            if(value>_m_bestValue)
            {
                _m_bestValue=value;
                StoreValueFunction(V);
                if(!_m_dryrun)
                    ExportValueFunction(_m_valueFunctionFilename);
            }
        }